

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O1

int lsrkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  undefined8 *puVar1;
  int iVar2;
  
  puVar1 = (undefined8 *)ark_mem->step_mem;
  if (puVar1 == (undefined8 *)0x0) {
    arkProcessError(ark_mem,-0x15,0x869,"lsrkStep_FullRHS",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,"Time step module memory is NULL.",t);
    return -0x15;
  }
  if (mode == 2) {
    iVar2 = (*(code *)*puVar1)(y,f,ark_mem->user_data);
    puVar1[4] = puVar1[4] + 1;
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = 0x1bb;
  }
  else {
    if (mode == 1) {
      if (*(int *)((long)puVar1 + 0x8c) != 0) {
        iVar2 = (*(code *)*puVar1)(t,y,ark_mem->fn,ark_mem->user_data);
        puVar1[4] = puVar1[4] + 1;
        ark_mem->fn_is_current = 1;
        if (iVar2 != 0) {
          iVar2 = 0x1ab;
          goto LAB_001494b0;
        }
      }
      N_VScale(0x3ff0000000000000,ark_mem->fn,f);
      return 0;
    }
    if (mode != 0) {
      arkProcessError(ark_mem,-8,0x1c4,"lsrkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,"Unknown full RHS mode");
      return -8;
    }
    if (ark_mem->fn_is_current != 0) {
      return 0;
    }
    iVar2 = (*(code *)*puVar1)(t,y,f,ark_mem->user_data);
    puVar1[4] = puVar1[4] + 1;
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = 0x197;
  }
LAB_001494b0:
  arkProcessError(ark_mem,-8,iVar2,"lsrkStep_FullRHS",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                  ,"At t = %.15g, the right-hand side routine failed in an unrecoverable manner.",t)
  ;
  return -8;
}

Assistant:

int lsrkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                     int mode)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* compute the RHS */
    if (!ark_mem->fn_is_current)
    {
      retval = step_mem->fe(t, y, f, ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return ARK_RHSFUNC_FAIL;
      }
    }

    break;

  case ARK_FULLRHS_END:
    /* No further action is needed if STS since the currently available STS methods
       evaluate the RHS at the end of each time step. If the stepper is an SSP, fn is
       updated and reused at the beginning of the step unless
       ark_mem->fn_is_current is changed by ARKODE. */
    if (step_mem->is_SSP)
    {
      retval = step_mem->fe(t, y, ark_mem->fn, ark_mem->user_data);
      step_mem->nfe++;
      ark_mem->fn_is_current = SUNTRUE;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return ARK_RHSFUNC_FAIL;
      }
    }
    N_VScale(ONE, ark_mem->fn, f);

    break;

  case ARK_FULLRHS_OTHER:

    /* call f */
    retval = step_mem->fe(t, y, f, ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return ARK_RHSFUNC_FAIL;
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return ARK_RHSFUNC_FAIL;
  }

  return ARK_SUCCESS;
}